

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O0

cell_index_t itree_add_sib(itree_t *t,cell_index_t end,cell_id_t id)

{
  cell_t *pcVar1;
  cell_index_t cVar2;
  cell_t *cell;
  cell_index_t new;
  cell_id_t id_local;
  cell_index_t end_local;
  itree_t *t_local;
  
  if (t->n_cell == t->max_n_cell) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
            ,0x77,"index cells exhausted (exceeded the allocated size %d)\n",(ulong)t->max_n_cell);
    exit(1);
  }
  cVar2 = itree_new_cell(t);
  pcVar1 = t->cell;
  if (cVar2 != 0) {
    pcVar1[end].sib = cVar2;
  }
  pcVar1[cVar2].id = id;
  pcVar1[cVar2].child = 0xffffffff;
  pcVar1[cVar2].sib = 0xffffffff;
  return cVar2;
}

Assistant:

cell_index_t itree_add_sib(itree_t *t,
			   cell_index_t end,
			   cell_id_t id)
{
    cell_index_t new;
    cell_t *cell;

    if (t->n_cell == t->max_n_cell) {
	E_FATAL("index cells exhausted (exceeded the allocated size %d)\n",t->max_n_cell);
    }

    new = itree_new_cell(t);

    cell = t->cell;
	
    if (new != 0)
	/* this is not the first cell, so link it w/ prior */
	cell[end].sib = new;
    
    cell[new].id = id;
    cell[new].child = NULL_INDEX;
    cell[new].sib = NULL_INDEX;

    return new;
}